

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.cpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::apply
          (Phase<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  complex<float> *vector_00;
  double __x;
  double __x_00;
  double dVar2;
  anon_class_16_2_357f297d aVar3;
  undefined1 local_40 [8];
  anon_class_16_2_357f297d f;
  complex<float> lambda;
  int qubit;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  Phase<std::complex<float>_> *this_local;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[3])();
  __x_00 = cos(this,__x);
  dVar2 = sin(this,__x_00);
  std::complex<float>::complex(&f.lambda,SUB84(__x_00,0),SUB84(dVar2,0));
  vector_00 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  aVar3 = lambda_Phase<std::complex<float>>(op,&f.lambda,vector_00);
  local_40 = (undefined1  [8])aVar3.vector;
  apply2b<qclab::qgates::lambda_Phase<std::complex<float>>(qclab::Op,std::complex<float>&,std::complex<float>*)::_lambda(unsigned_long)_1_>
            (nbQubits,iVar1 + offset,(anon_class_16_2_357f297d *)local_40);
  return;
}

Assistant:

void Phase< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply2b( nbQubits , qubit , f ) ;
  }